

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_emit.cpp
# Opt level: O0

void __thiscall pstore::exchange::export_ns::emit_digest(export_ns *this,ostream_base *os,uint128 d)

{
  undefined8 os_00;
  iterator pvVar1;
  char *pcVar2;
  storage_type<pstore::gsl::details::extent_type<32L>_> local_50;
  char *local_48;
  const_iterator out;
  array<char,_32UL> hex;
  ostream_base *os_local;
  uint128 d_local;
  
  hex._M_elems._24_8_ = this;
  os_local = os;
  pvVar1 = std::array<char,_32UL>::begin((array<char,_32UL> *)&out);
  pcVar2 = uint128::to_hex<char*>((uint128 *)&os_local,pvVar1);
  local_48 = pcVar2;
  pvVar1 = std::array<char,_32UL>::end((array<char,_32UL> *)&out);
  if (pcVar2 == pvVar1) {
    operator<<((ostream_base *)hex._M_elems._24_8_,'\"');
    os_00 = hex._M_elems._24_8_;
    local_50.data_ = (pointer)gsl::make_span<char,32ul>((array<char,_32UL> *)&out);
    details::write_span<char,32l>((ostream_base *)os_00,(span<char,_32L> *)&local_50);
    operator<<((ostream_base *)hex._M_elems._24_8_,'\"');
    return;
  }
  assert_failed("out == hex.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export_emit.cpp"
                ,0x21);
}

Assistant:

void emit_digest (ostream_base & os, uint128 const d) {
                std::array<char, uint128::hex_string_length> hex;
                decltype (hex)::const_iterator const out = d.to_hex (hex.begin ());
                (void) out;
                PSTORE_ASSERT (out == hex.end ());
                os << '"';
                details::write_span (os, gsl::make_span (hex));
                os << '"';
            }